

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_272f4d1::GetSseSum16x16DualTest_RefMseSum_Test::TestBody
          (GetSseSum16x16DualTest_RefMseSum_Test *this)

{
  undefined8 *puVar1;
  int source_stride;
  uint32_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  pointer *__ptr;
  uint32_t *sse16x16;
  long lVar6;
  uint *puVar7;
  SEARCH_METHODS *pSVar8;
  int iVar9;
  uint *puVar10;
  ACMRandom *this_00;
  uint32_t *var16x16;
  uint16_t in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4b8;
  AssertHelper local_4b0;
  RegisterStateCheckMMX reg_check_mmx;
  int sum_tot_simd;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  int local_47c;
  int local_478;
  int local_474;
  ACMRandom *local_470;
  long local_468;
  long local_460;
  long local_458;
  GetSseSum16x16DualTest_RefMseSum_Test *local_450;
  uint *local_448;
  uint *local_440;
  uint var2 [64];
  uint var1 [64];
  uint sse2 [64];
  uint sse1 [64];
  
  this_00 = &(this->super_GetSseSum16x16DualTest).rnd_;
  local_47c = 0;
  local_470 = this_00;
  local_450 = this;
  do {
    if (0 < (this->super_GetSseSum16x16DualTest).params_.block_size) {
      lVar5 = 0;
      do {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_GetSseSum16x16DualTest).src_[lVar5] = (uint8_t)(uVar2 >> 0x17);
        uVar2 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
        (this->super_GetSseSum16x16DualTest).ref_[lVar5] = (uint8_t)(uVar2 >> 0x17);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->super_GetSseSum16x16DualTest).params_.block_size);
    }
    memset(sse1,0,0x100);
    memset(sse2,0,0x100);
    memset(var1,0,0x100);
    memset(var2,0,0x100);
    sse_tot_c = 0;
    sse_tot_simd = 0;
    sum_tot_c = 0;
    sum_tot_simd = 0;
    iVar4 = (this->super_GetSseSum16x16DualTest).params_.height;
    if (0 < iVar4) {
      iVar3 = (this->super_GetSseSum16x16DualTest).params_.width;
      local_468 = (long)iVar3 << 4;
      lVar5 = 0;
      lVar6 = 0;
      iVar9 = 0;
      local_478 = iVar3;
      do {
        source_stride = local_478;
        if (0 < iVar3) {
          var16x16 = var2 + iVar9;
          sse16x16 = sse2 + iVar9;
          puVar10 = var1 + iVar9;
          puVar7 = sse1 + iVar9;
          iVar4 = 0;
          local_460 = lVar6;
          local_458 = lVar5;
          do {
            local_474 = iVar9;
            reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
            reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
            reg_check_mmx.pre_fpu_env_[0] = in_FPUControlWord;
            reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
            local_448 = puVar7;
            local_440 = puVar10;
            (*(this->super_GetSseSum16x16DualTest).params_.func)
                      ((this->super_GetSseSum16x16DualTest).src_ + lVar5,source_stride,
                       (this->super_GetSseSum16x16DualTest).ref_ + lVar5,source_stride,puVar7,
                       &sse_tot_simd,&sum_tot_simd,puVar10);
            libaom_test::RegisterStateCheckMMX::Check(&reg_check_mmx);
            this = local_450;
            aom_get_var_sse_sum_16x16_dual_c
                      ((local_450->super_GetSseSum16x16DualTest).src_ + lVar5,source_stride,
                       (local_450->super_GetSseSum16x16DualTest).ref_ + lVar5,source_stride,sse16x16
                       ,&sse_tot_c,&sum_tot_c,var16x16);
            iVar3 = (this->super_GetSseSum16x16DualTest).params_.width;
            iVar9 = local_474 + 2;
            var16x16 = var16x16 + 2;
            sse16x16 = sse16x16 + 2;
            puVar10 = local_440 + 2;
            puVar7 = local_448 + 2;
            iVar4 = iVar4 + 0x20;
            lVar5 = lVar5 + 0x20;
          } while (iVar4 < iVar3);
          iVar4 = (this->super_GetSseSum16x16DualTest).params_.height;
          lVar5 = local_458;
          lVar6 = local_460;
          this_00 = local_470;
        }
        lVar6 = lVar6 + 0x10;
        lVar5 = lVar5 + local_468;
      } while (lVar6 < iVar4);
    }
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              ((internal *)&reg_check_mmx,"sse_tot_c","sse_tot_simd",&sse_tot_c,&sse_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4b8);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar8 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar8 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3ef,(char *)pSVar8);
      testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      if (local_4b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&reg_check_mmx,"sum_tot_c","sum_tot_simd",&sum_tot_c,&sum_tot_simd);
    if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
      testing::Message::Message((Message *)&local_4b8);
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      pSVar8 = "";
      if (puVar1 != (undefined8 *)0x0) {
        pSVar8 = (SEARCH_METHODS *)*puVar1;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_4b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                 ,0x3f0,(char *)pSVar8);
      testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
      testing::internal::AssertHelper::~AssertHelper(&local_4b0);
      if (local_4b8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
      }
    }
    puVar1 = (undefined8 *)
             CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                      CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    lVar5 = 0;
    do {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1[p]","sse2[p]",(uint *)((long)sse1 + lVar5),
                 (uint *)((long)sse2 + lVar5));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4b8);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar8 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f2,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if (local_4b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse_tot_simd","sse_tot_c",&sse_tot_simd,&sse_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4b8);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar8 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f3,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if (local_4b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&reg_check_mmx,"sum_tot_simd","sum_tot_c",&sum_tot_simd,&sum_tot_c);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4b8);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar8 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f4,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if (local_4b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1[p]","var2[p]",(uint *)((long)var1 + lVar5),
                 (uint *)((long)var2 + lVar5));
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_4b8);
        puVar1 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar8 = "";
        if (puVar1 != (undefined8 *)0x0) {
          pSVar8 = (SEARCH_METHODS *)*puVar1;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_4b0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x3f5,(char *)pSVar8);
        testing::internal::AssertHelper::operator=(&local_4b0,(Message *)&local_4b8);
        testing::internal::AssertHelper::~AssertHelper(&local_4b0);
        if (local_4b8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_4b8._M_head_impl + 8))();
        }
      }
      puVar1 = (undefined8 *)
               CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                        CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
      if (puVar1 != (undefined8 *)0x0) {
        if ((undefined8 *)*puVar1 != puVar1 + 2) {
          operator_delete((undefined8 *)*puVar1);
        }
        operator_delete(puVar1);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x100);
    local_47c = local_47c + 1;
  } while (local_47c != 10);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, RefMseSum) { RefTestSseSumDual(); }